

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

void __thiscall Vault::JwtStrategy::~JwtStrategy(JwtStrategy *this)

{
  ~JwtStrategy(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

JwtStrategy(RoleId role, Jwt jwt)
    : role_(std::move(role))
    , jwt_(std::move(jwt))
    , mount_(Path{"jwt"})
  {}